

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O0

void __thiscall wasm::ConstHoisting::visitFunction(ConstHoisting *this,Function *curr)

{
  bool bVar1;
  Module *wasm;
  Block *pBVar2;
  Builder local_a0;
  Builder builder;
  Literal local_90;
  size_type local_78;
  size_type num;
  type *vec;
  type *value;
  _Self local_58;
  iterator __end2;
  _Self local_40;
  iterator __begin2;
  InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> prelude;
  Function *curr_local;
  ConstHoisting *this_local;
  
  prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  __begin2._M_node = (_List_node_base *)&this->uses;
  local_40._M_node =
       (_List_node_base *)
       InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
       ::begin((InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                *)__begin2._M_node);
  local_58._M_node =
       (_List_node_base *)
       InsertOrderedMap<wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
       ::end(__begin2._M_node);
  while (bVar1 = std::operator!=(&local_40,&local_58), bVar1) {
    value = &std::
             _List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
             ::operator*(&local_40)->first;
    vec = (type *)std::
                  get<0ul,wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
                            ((pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                              *)value);
    num = (size_type)
          std::
          get<1ul,wasm::Literal_const,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
                    ((pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                      *)value);
    local_78 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::size
                         ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)num);
    wasm::Literal::Literal(&local_90,(Literal *)vec);
    bVar1 = worthHoisting(this,&local_90,(Index)local_78);
    wasm::Literal::~Literal(&local_90);
    if (bVar1) {
      builder.wasm = (Module *)
                     hoist(this,(vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *
                                )num);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                 (value_type *)&builder);
    }
    std::
    _List_iterator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
    ::operator++(&local_40);
  }
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  if (!bVar1) {
    wasm = Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
                       ).
                       super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                       .super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                     );
    Builder::Builder(&local_a0,wasm);
    pBVar2 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&local_a0,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2
                       );
    pBVar2 = Builder::makeSequence
                       (&local_a0,(Expression *)pBVar2,
                        prelude.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[0xc]);
    prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[0xc] = (Expression *)pBVar2;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    std::vector<Expression*> prelude;
    for (auto& [value, vec] : uses) {
      auto num = vec.size();
      if (worthHoisting(value, num)) {
        prelude.push_back(hoist(vec));
      }
    }
    if (!prelude.empty()) {
      Builder builder(*getModule());
      // merge-blocks can optimize this into a single block later in most cases
      curr->body = builder.makeSequence(builder.makeBlock(prelude), curr->body);
    }
  }